

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmwavebs.cpp
# Opt level: O0

void __thiscall mmWaveBS::mmWaveBS(mmWaveBS *this,double x,double y,uint32_t id,Status st)

{
  Status st_local;
  uint32_t id_local;
  double y_local;
  double x_local;
  mmWaveBS *this_local;
  
  Signal<const_candidacy_msg_&>::Signal(&this->candidacy);
  Signal<const_cluster_head_msg_&>::Signal(&this->clusterHead);
  Signal<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Signal(&this->conflict);
  memset(&this->the_thread,0,8);
  std::thread::thread(&this->the_thread);
  this->stop_thread = false;
  this->cluster_id = 0xffffffff;
  this->m_xx = x;
  this->m_yy = y;
  this->m_id = id;
  this->m_status = st;
  return;
}

Assistant:

mmWaveBS::mmWaveBS(double x, double y, uint32_t id, Status st)
: the_thread()
{
	m_xx =x; m_yy =y; m_id =id; m_status = st;
}